

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O0

int __thiscall Clique::init(Clique *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  undefined4 extraout_var;
  unsigned_long *puVar6;
  AlignmentRecord *ap;
  size_t i;
  int n;
  size_type in_stack_ffffffffffffffa8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  ulong local_30;
  ulong local_28;
  AlignmentRecord *local_20;
  ulong local_18;
  int local_c;
  Clique *local_8;
  
  local_c = 0;
  this->alignment_count = 0;
  local_8 = this;
  for (local_18 = 0; uVar1 = local_18,
      sVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (this->alignment_set), uVar1 < sVar5; local_18 = local_18 + 1) {
    bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (bVar2) {
      iVar3 = (*this->parent->_vptr_CliqueFinder[5])(this->parent,local_18);
      local_20 = (AlignmentRecord *)CONCAT44(extraout_var,iVar3);
      if (local_c == 0) {
        local_c = local_c + 1;
        uVar4 = AlignmentRecord::getIntervalStart(local_20);
        this->leftmost_segment_start = (ulong)uVar4;
        uVar4 = AlignmentRecord::getIntervalEnd(local_20);
        this->rightmost_segment_end = (ulong)uVar4;
      }
      else {
        in_stack_ffffffffffffffb0 =
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             &this->leftmost_segment_start;
        local_c = local_c + 1;
        uVar4 = AlignmentRecord::getIntervalStart(local_20);
        local_28 = (ulong)uVar4;
        puVar6 = std::min<unsigned_long>((unsigned_long *)in_stack_ffffffffffffffb0,&local_28);
        this->leftmost_segment_start = *puVar6;
        uVar4 = AlignmentRecord::getIntervalEnd(local_20);
        local_30 = (ulong)uVar4;
        puVar6 = std::max<unsigned_long>(&this->rightmost_segment_end,&local_30);
        this->rightmost_segment_end = *puVar6;
      }
      this->alignment_count = this->alignment_count + 1;
    }
  }
  return (int)uVar1;
}

Assistant:

void Clique::init() {
	int n = 0;
	alignment_count = 0;
	// for (size_t i=alignment_set->find_first(); i!=alignment_set_t::npos; i=alignment_set->find_next(i)) {
	for (size_t i=0; i<alignment_set->size(); ++i) {
		if (!alignment_set->test(i)) continue;
		const AlignmentRecord& ap = parent.getAlignmentByIndex(i);
		if (n++==0) {
			leftmost_segment_start = ap.getIntervalStart();
			rightmost_segment_end = ap.getIntervalEnd();
		} else {
			leftmost_segment_start = min(leftmost_segment_start, (size_t)ap.getIntervalStart());
			rightmost_segment_end = max(rightmost_segment_end, (size_t)ap.getIntervalEnd());
		}
		alignment_count += 1;
	}
}